

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingFileError_Test::TestBody
          (DescriptorDatabaseTest_ConflictingFileError_Test *this)

{
  DescriptorDatabaseTest_ConflictingFileError_Test *this_local;
  
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"foo.proto\" message_type {   name: \"Foo\" }");
  DescriptorDatabaseTest::AddToDatabaseWithError
            (&this->super_DescriptorDatabaseTest,
             "name: \"foo.proto\" message_type {   name: \"Bar\" }");
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingFileError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
  AddToDatabaseWithError(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Bar\" "
      "}");
}